

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O1

void helper_vmsummbm_ppc(CPUPPCState_conflict *env,ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,
                        ppc_avr_t *c)

{
  long lVar1;
  int32_t prod [16];
  
  lVar1 = 0;
  do {
    prod[lVar1] = (uint)b->u8[lVar1] * (int)a->s8[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  lVar1 = 0xc;
  do {
    *(int32_t *)((long)r + lVar1) =
         prod[lVar1] + *(int *)((long)c + lVar1) + prod[lVar1 + 1] + prod[lVar1 + 2] +
         prod[lVar1 + 3];
    lVar1 = lVar1 + -4;
  } while (lVar1 != -4);
  return;
}

Assistant:

void helper_vmsummbm(CPUPPCState *env, ppc_avr_t *r, ppc_avr_t *a,
                     ppc_avr_t *b, ppc_avr_t *c)
{
    int32_t prod[16];
    int i;

    for (i = 0; i < ARRAY_SIZE(r->s8); i++) {
        prod[i] = (int32_t)a->s8[i] * b->u8[i];
    }

    VECTOR_FOR_INORDER_I(i, s32) {
        r->s32[i] = c->s32[i] + prod[4 * i] + prod[4 * i + 1] +
            prod[4 * i + 2] + prod[4 * i + 3];
    }
}